

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void __thiscall CTcDataStream::alloc_page(CTcDataStream *this)

{
  void *pvVar1;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x28) + 1U < *(ulong *)(in_RDI + 0x40)) {
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
    *(undefined8 *)(in_RDI + 0x18) =
         *(undefined8 *)(*(long *)(in_RDI + 0x30) + *(long *)(in_RDI + 0x28) * 8);
    *(undefined8 *)(in_RDI + 0x20) = 65000;
  }
  else {
    if (*(ulong *)(in_RDI + 0x38) <= *(ulong *)(in_RDI + 0x40)) {
      *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) + 100;
      if (*(long *)(in_RDI + 0x30) == 0) {
        pvVar1 = malloc(*(long *)(in_RDI + 0x38) << 3);
        *(void **)(in_RDI + 0x30) = pvVar1;
      }
      else {
        pvVar1 = realloc(*(void **)(in_RDI + 0x30),*(long *)(in_RDI + 0x38) << 3);
        *(void **)(in_RDI + 0x30) = pvVar1;
      }
      if (*(long *)(in_RDI + 0x30) == 0) {
        err_throw(0);
      }
    }
    pvVar1 = malloc(65000);
    *(void **)(*(long *)(in_RDI + 0x30) + *(long *)(in_RDI + 0x40) * 8) = pvVar1;
    if (*(long *)(*(long *)(in_RDI + 0x30) + *(long *)(in_RDI + 0x40) * 8) == 0) {
      err_throw(0);
    }
    *(undefined8 *)(in_RDI + 0x18) =
         *(undefined8 *)(*(long *)(in_RDI + 0x30) + *(long *)(in_RDI + 0x40) * 8);
    *(undefined8 *)(in_RDI + 0x20) = 65000;
    *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(in_RDI + 0x40);
    *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) + 1;
  }
  return;
}

Assistant:

void CTcDataStream::alloc_page()
{
    /* 
     *   if we're coming back to a page that was previously allocated, we
     *   need merely re-establish the existing page 
     */
    if (page_cur_ + 1 < page_cnt_)
    {
        /* move to the next page */
        ++page_cur_;

        /* start writing at the start of the page */
        wp_ = pages_[page_cur_];
        rem_ = TCCS_PAGE_SIZE;

        /* we're done */
        return;
    }

    /* 
     *   if we don't have room for a new page in the page array, expand
     *   the page array 
     */
    if (page_cnt_ >= page_slots_)
    {
        /* increase the page slot count */
        page_slots_ += 100;

        /* allocate or reallocate the page array */
        if (pages_ == 0)
            pages_ = (char **)t3malloc(page_slots_ * sizeof(pages_[0]));
        else
            pages_ = (char **)t3realloc(pages_,
                                        page_slots_ * sizeof(pages_[0]));

        /* if that failed, throw an error */
        if (pages_ == 0)
            err_throw(TCERR_CODEGEN_NO_MEM);
    }

    /* allocate the new page */
    pages_[page_cnt_] = (char *)t3malloc(TCCS_PAGE_SIZE);

    /* throw an error if we couldn't allocate the page */
    if (pages_[page_cnt_] == 0)
        err_throw(TCERR_CODEGEN_NO_MEM);

    /* start writing at the start of the new page */
    wp_ = pages_[page_cnt_];

    /* the entire page is free */
    rem_ = TCCS_PAGE_SIZE;

    /* make the new page the current page */
    page_cur_ = page_cnt_;

    /* count the new page */
    ++page_cnt_;
}